

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ST2052_TextParser.cpp
# Opt level: O1

IResourceResolver * __thiscall
AS_02::TimedText::ST2052_TextParser::h__TextParser::GetDefaultResolver(h__TextParser *this)

{
  IResourceResolver *pIVar1;
  Type5UUIDFilenameResolver *this_00;
  long *local_a0 [2];
  long local_90 [2];
  Type5UUIDFilenameResolver local_80;
  
  if ((this->m_DefaultResolver).m_p == (IResourceResolver *)0x0) {
    this_00 = (Type5UUIDFilenameResolver *)operator_new(0x58);
    Type5UUIDFilenameResolver::Type5UUIDFilenameResolver(this_00);
    Kumu::PathDirname((string *)local_a0,(char)this + -0x50);
    Type5UUIDFilenameResolver::OpenRead(&local_80,(string *)this_00);
    Kumu::Result_t::~Result_t((Result_t *)&local_80);
    if (local_a0[0] != local_90) {
      operator_delete(local_a0[0],local_90[0] + 1);
    }
    pIVar1 = (this->m_DefaultResolver).m_p;
    if (pIVar1 != (IResourceResolver *)0x0) {
      (*pIVar1->_vptr_IResourceResolver[1])();
    }
    (this->m_DefaultResolver).m_p = (IResourceResolver *)this_00;
  }
  return (this->m_DefaultResolver).m_p;
}

Assistant:

ASDCP::TimedText::IResourceResolver* GetDefaultResolver()
  {
    if ( m_DefaultResolver.empty() )
      {
	AS_02::TimedText::Type5UUIDFilenameResolver *resolver = new AS_02::TimedText::Type5UUIDFilenameResolver;
	resolver->OpenRead(PathDirname(m_Filename));
	m_DefaultResolver = resolver;
      }
    
    return m_DefaultResolver;
  }